

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

shared_ptr<const_pstore::repo::fragment> __thiscall
pstore::database::getro<pstore::repo::fragment,void>
          (database *this,extent<pstore::repo::fragment> *ex)

{
  ulong *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::repo::fragment> sVar1;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((*in_RDX & 0xf) == 0) {
    (**(code **)((ex->addr).a_.a_ + 0x10))(local_20,ex,*in_RDX,in_RDX[1],1,0);
    std::static_pointer_cast<pstore::repo::fragment_const,void_const>
              ((shared_ptr<const_void> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    sVar1.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_pstore::repo::fragment>)
           sVar1.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>;
  }
  raise<pstore::error_code>(bad_alignment);
}

Assistant:

std::shared_ptr<T const> database::getro (extent<T> const & ex) const {
        if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        // Note that ex.size specifies the size in bytes of the data to be loaded, not the
        // number of elements of type T. For this reason we call the plain address version of
        // getro().
        return std::static_pointer_cast<T const> (this->getro (ex.addr.to_address (), ex.size));
    }